

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O0

void __thiscall leveldb::IteratorWrapper::Set(IteratorWrapper *this,Iterator *iter)

{
  IteratorWrapper *in_RSI;
  long *in_RDI;
  
  if ((long *)*in_RDI != (long *)0x0) {
    (**(code **)(*(long *)*in_RDI + 8))();
  }
  *in_RDI = (long)in_RSI;
  if (*in_RDI == 0) {
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  else {
    Update(in_RSI);
  }
  return;
}

Assistant:

void Set(Iterator* iter) {
    delete iter_;
    iter_ = iter;
    if (iter_ == nullptr) {
      valid_ = false;
    } else {
      Update();
    }
  }